

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Matrix<double> * __thiscall
Matrix<double>::compile
          (Matrix<double> *__return_storage_ptr__,Matrix<double> *this,uint beg_col,uint end_col)

{
  double dVar1;
  uint uVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  long lVar4;
  ulong uVar5;
  
  Matrix(__return_storage_ptr__,(this->m_shape).n_row,end_col - beg_col);
  uVar2 = (__return_storage_ptr__->m_shape).n_row;
  if (uVar2 != 0) {
    uVar5 = 0;
    do {
      if (beg_col < end_col) {
        lVar4 = 0;
        do {
          dVar1 = *(double *)
                   (*(long *)&(this->m_elems).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar5].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data + (ulong)beg_col * 8 + lVar4 * 8);
          pvVar3 = operator[](__return_storage_ptr__,(uint)uVar5);
          (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar4] = dVar1;
          lVar4 = lVar4 + 1;
        } while (end_col - beg_col != (uint)lVar4);
        uVar2 = (__return_storage_ptr__->m_shape).n_row;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T> Matrix<T>::compile(unsigned beg_col, unsigned end_col) const{
    Matrix<T> matrix(m_shape.n_row, end_col-beg_col);

    for(unsigned i=0;i<matrix.m_shape.n_row;++i){
        for(unsigned j=beg_col;j<end_col;++j){
            matrix[i][j-beg_col]=m_elems[i][j];
        }
    }

    return matrix;
}